

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_address.cpp
# Opt level: O2

int __thiscall zmq::ipc_address_t::resolve(ipc_address_t *this,char *path_)

{
  char *__dest;
  size_t sVar1;
  int *piVar2;
  
  sVar1 = strlen(path_);
  if (sVar1 < 0x6c) {
    if ((*path_ != '@') || (path_[1] != '\0')) {
      (this->_address).sun_family = 1;
      __dest = (this->_address).sun_path;
      memcpy(__dest,path_,sVar1 + 1);
      if (*path_ == '@') {
        *__dest = '\0';
      }
      this->_addrlen = (int)sVar1 + 2;
      return 0;
    }
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x24;
  }
  return -1;
}

Assistant:

int zmq::ipc_address_t::resolve (const char *path_)
{
    const size_t path_len = strlen (path_);
    if (path_len >= sizeof _address.sun_path) {
        errno = ENAMETOOLONG;
        return -1;
    }
    if (path_[0] == '@' && !path_[1]) {
        errno = EINVAL;
        return -1;
    }

    _address.sun_family = AF_UNIX;
    memcpy (_address.sun_path, path_, path_len + 1);
    /* Abstract sockets start with '\0' */
    if (path_[0] == '@')
        *_address.sun_path = '\0';

    _addrlen =
      static_cast<socklen_t> (offsetof (sockaddr_un, sun_path) + path_len);
    return 0;
}